

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

bool winmd::reader::is_const(ParamSig *param)

{
  bool bVar1;
  TypeDefOrRef TVar2;
  __normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>
  *p_Var3;
  coded_index<winmd::reader::TypeDefOrRef> cVar4;
  TypeDef TVar5;
  TypeRef TVar6;
  TypeRef local_a0;
  table_base *local_90;
  uint32_t local_88;
  TypeDef local_80;
  table_base *local_70;
  uint32_t local_68;
  undefined1 local_60 [8];
  coded_index<winmd::reader::TypeDefOrRef> type;
  CustomModSig *cmod;
  __normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>
  __end2;
  __normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>
  __begin2;
  pair<__gnu_cxx::__normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>_>
  *__range2;
  ParamSig *pPStack_18;
  anon_class_1_0_00000001 is_type_const;
  ParamSig *param_local;
  
  pPStack_18 = param;
  ___begin2 = ParamSig::CustomMod(param);
  p_Var3 = begin<__gnu_cxx::__normal_iterator<winmd::reader::CustomModSig_const*,std::vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>>>>
                     ((pair<__gnu_cxx::__normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>_>
                       *)&__begin2);
  __end2._M_current = p_Var3->_M_current;
  p_Var3 = end<__gnu_cxx::__normal_iterator<winmd::reader::CustomModSig_const*,std::vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>>>>
                     ((pair<__gnu_cxx::__normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>_>
                       *)&__begin2);
  cmod = p_Var3->_M_current;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>
                                *)&cmod);
    if (!bVar1) {
      return false;
    }
    type.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>
         ::operator*(&__end2);
    cVar4 = CustomModSig::Type((CustomModSig *)
                               type.super_typed_index<winmd::reader::TypeDefOrRef>.
                               super_index_base<winmd::reader::TypeDefOrRef>._8_8_);
    local_70 = cVar4.super_typed_index<winmd::reader::TypeDefOrRef>.
               super_index_base<winmd::reader::TypeDefOrRef>.m_table;
    local_68 = cVar4.super_typed_index<winmd::reader::TypeDefOrRef>.
               super_index_base<winmd::reader::TypeDefOrRef>.m_value;
    local_60 = (undefined1  [8])local_70;
    type.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_table._0_4_ = local_68;
    TVar2 = index_base<winmd::reader::TypeDefOrRef>::type
                      ((index_base<winmd::reader::TypeDefOrRef> *)local_60);
    if (TVar2 == TypeDef) {
      TVar5 = typed_index<winmd::reader::TypeDefOrRef>::TypeDef
                        ((typed_index<winmd::reader::TypeDefOrRef> *)local_60);
      local_90 = TVar5.super_row_base<winmd::reader::TypeDef>.m_table;
      local_88 = TVar5.super_row_base<winmd::reader::TypeDef>.m_index;
      local_80.super_row_base<winmd::reader::TypeDef>.m_table = local_90;
      local_80.super_row_base<winmd::reader::TypeDef>.m_index = local_88;
      bVar1 = is_const(winmd::reader::ParamSig_const&)::{lambda(auto:1&&)#1}::operator()
                        ((_lambda_auto_1____1_ *)((long)&__range2 + 7),&local_80);
      if (bVar1) {
        return true;
      }
    }
    else {
      TVar2 = index_base<winmd::reader::TypeDefOrRef>::type
                        ((index_base<winmd::reader::TypeDefOrRef> *)local_60);
      if (TVar2 == TypeRef) {
        TVar6 = typed_index<winmd::reader::TypeDefOrRef>::TypeRef
                          ((typed_index<winmd::reader::TypeDefOrRef> *)local_60);
        local_a0.super_row_base<winmd::reader::TypeRef>.m_table =
             TVar6.super_row_base<winmd::reader::TypeRef>.m_table;
        local_a0.super_row_base<winmd::reader::TypeRef>.m_index =
             TVar6.super_row_base<winmd::reader::TypeRef>.m_index;
        bVar1 = is_const(winmd::reader::ParamSig_const&)::{lambda(auto:1&&)#1}::operator()
                          ((_lambda_auto_1____1_ *)((long)&__range2 + 7),&local_a0);
        if (bVar1) {
          return true;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_winmd::reader::CustomModSig_*,_std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

inline bool is_const(ParamSig const& param)
    {
        auto is_type_const = [](auto&& type)
        {
            return type.TypeNamespace() == "System.Runtime.CompilerServices" && type.TypeName() == "IsConst";
        };

        for (auto const& cmod : param.CustomMod())
        {
            auto type = cmod.Type();

            if (type.type() == TypeDefOrRef::TypeDef)
            {
                if (is_type_const(type.TypeDef()))
                {
                    return true;
                }
            }
            else if (type.type() == TypeDefOrRef::TypeRef)
            {
                if (is_type_const(type.TypeRef()))
                {
                    return true;
                }
            }
        }

        return false;
    }